

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::HasGoogleTestFlagPrefix(char *str)

{
  bool bVar1;
  long in_FS_OFFSET;
  bool local_1a;
  bool local_19;
  char *local_18;
  char *str_local;
  
  str_local = *(char **)(in_FS_OFFSET + 0x28);
  local_18 = str;
  bVar1 = SkipPrefix("--",&local_18);
  if ((!bVar1) && (bVar1 = SkipPrefix("-",&local_18), !bVar1)) {
    bVar1 = SkipPrefix("/",&local_18);
    local_19 = false;
    if (!bVar1) goto LAB_001b5a30;
  }
  bVar1 = SkipPrefix("gtest_internal_",&local_18);
  local_19 = false;
  if (!bVar1) {
    bVar1 = SkipPrefix("gtest_",&local_18);
    local_1a = true;
    if (!bVar1) {
      local_1a = SkipPrefix("gtest-",&local_18);
    }
    local_19 = local_1a;
  }
LAB_001b5a30:
  if (*(char **)(in_FS_OFFSET + 0x28) != str_local) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

static bool HasGoogleTestFlagPrefix(const char* str) {
  return (SkipPrefix("--", &str) ||
          SkipPrefix("-", &str) ||
          SkipPrefix("/", &str)) &&
         !SkipPrefix(GTEST_FLAG_PREFIX_ "internal_", &str) &&
         (SkipPrefix(GTEST_FLAG_PREFIX_, &str) ||
          SkipPrefix(GTEST_FLAG_PREFIX_DASH_, &str));
}